

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ircbot.cpp
# Opt level: O0

bool __thiscall ircBot::IsCommand(ircBot *this,char *buff)

{
  bool bVar1;
  char *p;
  char *c;
  char *buff_local;
  ircBot *this_local;
  
  bVar1 = checkping(this,buff);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    ParseMessage(this,buff);
    if (((this->msg).message[0] == '#') || ((this->msg).message[0] == '@')) {
      p = (this->msg).message + 1;
      conoutf("%s",p);
      execute(p);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ircBot::IsCommand(char *buff)
{
    if(!checkping(buff))
    {
        ParseMessage(buff);
        if(msg.message[0] == '#' || msg.message[0] == '@')
        {
            char *c = msg.message;
            c++;
            conoutf("%s", c); //<-- silenced warning, old: conoutf(c);
            execute(c);
            return true;
        }return false;
    }return true;
}